

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

void Kf_ManStoreAddUnit(Vec_Int_t *vTemp,int iObj,int Time,float Area)

{
  int iVar1;
  float Area_local;
  int Time_local;
  int iObj_local;
  Vec_Int_t *vTemp_local;
  
  Vec_IntAddToEntry(vTemp,0,1);
  Vec_IntPush(vTemp,1);
  iVar1 = Abc_Var2Lit(iObj,0);
  Vec_IntPush(vTemp,iVar1);
  Vec_IntPush(vTemp,2);
  Vec_IntPush(vTemp,Time);
  iVar1 = Abc_Float2Int(Area);
  Vec_IntPush(vTemp,iVar1);
  return;
}

Assistant:

static inline void Kf_ManStoreAddUnit( Vec_Int_t * vTemp, int iObj, int Time, float Area )
{
    Vec_IntAddToEntry( vTemp, 0, 1 );
    Vec_IntPush( vTemp, 1 );                    // cut size
    Vec_IntPush( vTemp, Abc_Var2Lit(iObj, 0) ); // leaf
    Vec_IntPush( vTemp, 2 );                    // function
    Vec_IntPush( vTemp, Time );                 // delay
    Vec_IntPush( vTemp, Abc_Float2Int(Area) );  // area
}